

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_dpps_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t mask)

{
  float32 fVar1;
  float32 fVar2;
  
  fVar1 = 0;
  if ((mask & 0x10) != 0) {
    fVar1 = float32_mul_x86_64(d->_s_ZMMReg[0],s->_s_ZMMReg[0],&env->sse_status);
    fVar1 = float32_add_x86_64(0,fVar1,&env->sse_status);
  }
  if ((mask & 0x20) != 0) {
    fVar2 = float32_mul_x86_64(d->_s_ZMMReg[1],s->_s_ZMMReg[1],&env->sse_status);
    fVar1 = float32_add_x86_64(fVar1,fVar2,&env->sse_status);
  }
  if ((mask & 0x40) != 0) {
    fVar2 = float32_mul_x86_64(d->_s_ZMMReg[2],s->_s_ZMMReg[2],&env->sse_status);
    fVar1 = float32_add_x86_64(fVar1,fVar2,&env->sse_status);
  }
  if ((char)mask < '\0') {
    fVar2 = float32_mul_x86_64(d->_s_ZMMReg[3],s->_s_ZMMReg[3],&env->sse_status);
    fVar1 = float32_add_x86_64(fVar1,fVar2,&env->sse_status);
  }
  d->_l_ZMMReg[0] = -(uint)((mask & 1) == 1) & fVar1;
  d->_l_ZMMReg[1] = -(uint)((mask & 2) == 2) & fVar1;
  d->_l_ZMMReg[2] = -(uint)((mask & 4) == 4) & fVar1;
  d->_l_ZMMReg[3] = -(uint)((mask & 8) == 8) & fVar1;
  return;
}

Assistant:

void glue(helper_dpps, SUFFIX)(CPUX86State *env, Reg *d, Reg *s, uint32_t mask)
{
    float32 iresult = float32_zero;

    if (mask & (1 << 4)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(0), s->ZMM_S(0),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 5)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(1), s->ZMM_S(1),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 6)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(2), s->ZMM_S(2),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 7)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(3), s->ZMM_S(3),
                                          &env->sse_status),
                              &env->sse_status);
    }
    d->ZMM_S(0) = (mask & (1 << 0)) ? iresult : float32_zero;
    d->ZMM_S(1) = (mask & (1 << 1)) ? iresult : float32_zero;
    d->ZMM_S(2) = (mask & (1 << 2)) ? iresult : float32_zero;
    d->ZMM_S(3) = (mask & (1 << 3)) ? iresult : float32_zero;
}